

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

Date_time * __thiscall iqxmlrpc::Value::cast<iqxmlrpc::Date_time>(Value *this)

{
  Bad_cast *this_00;
  Date_time *local_38;
  Date_time *t;
  Value *this_local;
  
  if (this->value == (Value_type *)0x0) {
    local_38 = (Date_time *)0x0;
  }
  else {
    local_38 = (Date_time *)__dynamic_cast(this->value,&Value_type::typeinfo,&Date_time::typeinfo,0)
    ;
  }
  if (local_38 == (Date_time *)0x0) {
    this_00 = (Bad_cast *)__cxa_allocate_exception(0x18);
    Bad_cast::Bad_cast(this_00);
    __cxa_throw(this_00,&Bad_cast::typeinfo,Bad_cast::~Bad_cast);
  }
  return local_38;
}

Assistant:

T* Value::cast() const
{
  T* t = dynamic_cast<T*>( value );
  if( !t )
    throw Bad_cast();
  return t;
}